

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void cmpsb_(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  
  if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    (pMyDisasm->Prefix).RepPrefix = '\x01';
  }
  if ((pMyDisasm->Reserved_).PrefRepne == 1) {
    (pMyDisasm->Prefix).RepnePrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10007;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cmpsb",6);
  (pMyDisasm->Operand1).OpType = 0x30000;
  (pMyDisasm->Operand1).OpSize = 8;
  (pMyDisasm->Operand1).Memory.BaseRegister = 0x80;
  (pMyDisasm->Operand1).AccessMode = 1;
  (pMyDisasm->Operand2).OpType = 0x30000;
  (pMyDisasm->Operand2).OpSize = 8;
  (pMyDisasm->Operand2).Memory.BaseRegister = 0x40;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x15].SF_;
  UVar4 = EFLAGS_TABLE[0x15].ZF_;
  UVar5 = EFLAGS_TABLE[0x15].AF_;
  UVar6 = EFLAGS_TABLE[0x15].PF_;
  UVar7 = EFLAGS_TABLE[0x15].CF_;
  UVar8 = EFLAGS_TABLE[0x15].TF_;
  UVar9 = EFLAGS_TABLE[0x15].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x15].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x15].NT_;
  UVar4 = EFLAGS_TABLE[0x15].RF_;
  UVar5 = EFLAGS_TABLE[0x15].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x15].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  return;
}

Assistant:

void __bea_callspec__ cmpsb_(PDISASM pMyDisasm)
{
  /* ========= 0xf3 */
  if (GV.PrefRepe == 1) {
      pMyDisasm->Prefix.RepPrefix = InUsePrefix;
  }
  /* ========= 0xf2 */
  if (GV.PrefRepne == 1) {
      pMyDisasm->Prefix.RepnePrefix = InUsePrefix;
  }
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+STRING_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cmpsb");
  #endif
  pMyDisasm->Operand1.OpType = MEMORY_TYPE;
  pMyDisasm->Operand1.OpSize = 8;
  pMyDisasm->Operand1.Memory.BaseRegister = REG7;
  pMyDisasm->Operand1.AccessMode = READ;
  pMyDisasm->Operand2.OpType = MEMORY_TYPE;
  pMyDisasm->Operand2.OpSize = 8;
  pMyDisasm->Operand2.Memory.BaseRegister = REG6;
  FillFlags(pMyDisasm,21);
  GV.EIP_++;
}